

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O1

void u_setTimeZoneFilesDirectory_63(char *path,UErrorCode *status)

{
  UBool UVar1;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (gTimeZoneFilesInitOnce_63.fState.super___atomic_base<int>._M_i != 2) {
      UVar1 = icu_63::umtx_initImplPreInit(&gTimeZoneFilesInitOnce_63);
      if (UVar1 != '\0') {
        TimeZoneDataDirInitFn(status);
        gTimeZoneFilesInitOnce_63.fErrCode = *status;
        icu_63::umtx_initImplPostInit(&gTimeZoneFilesInitOnce_63);
        goto LAB_00294ed5;
      }
    }
    if (U_ZERO_ERROR < gTimeZoneFilesInitOnce_63.fErrCode) {
      *status = gTimeZoneFilesInitOnce_63.fErrCode;
    }
  }
LAB_00294ed5:
  setTimeZoneFilesDir(path,status);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_setTimeZoneFilesDirectory(const char *path, UErrorCode *status) {
    umtx_initOnce(gTimeZoneFilesInitOnce, &TimeZoneDataDirInitFn, *status);
    setTimeZoneFilesDir(path, *status);

    // Note: this function does some extra churn, first setting based on the
    //       environment, then immediately replacing with the value passed in.
    //       The logic is simpler that way, and performance shouldn't be an issue.
}